

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

double sexp_bignum_to_double(sexp a)

{
  undefined8 uVar1;
  sexp_uint_t sVar2;
  sexp_uint_t sVar3;
  sexp_uint_t sVar4;
  double dVar5;
  
  sVar2 = (a->value).string.offset;
  do {
    sVar3 = sVar2;
    if (sVar3 == 1) {
      sVar4 = 1;
      break;
    }
    sVar4 = sVar3;
    sVar2 = sVar3 - 1;
  } while (*(long *)((long)&a->value + sVar3 * 8 + 8) == 0);
  dVar5 = 0.0;
  if (-1 < (long)(sVar4 - 1)) {
    do {
      uVar1 = *(undefined8 *)((long)&a->value + sVar3 * 8 + 8);
      dVar5 = dVar5 * 1.8446744073709552e+19 +
              ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      sVar3 = sVar3 - 1;
    } while (0 < (long)sVar3);
  }
  return (double)(int)(a->value).flonum_bits[0] * dVar5;
}

Assistant:

double sexp_bignum_to_double (sexp a) {
  double res = 0;
  sexp_sint_t i;
  sexp_uint_t *data=sexp_bignum_data(a);
  for (i=sexp_bignum_hi(a)-1; i>=0; i--)
    res = res * ((double)SEXP_UINT_T_MAX+1) + data[i];
  return res * sexp_bignum_sign(a);
}